

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O1

bool __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,Ref This,float *u,
          float *v,float dscale,size_t depth)

{
  undefined8 *puVar1;
  uint uVar2;
  vfloat_impl<4> *pvVar3;
  vfloat_impl<4> *pvVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  vfloat_impl<4> *pvVar7;
  vfloat_impl<4> *pvVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  bool bVar40;
  size_t i;
  float *pfVar41;
  long lVar42;
  ulong uVar43;
  DynamicStackArray<float,_16UL,_64UL> *pDVar44;
  Ref This_00;
  size_t *psVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  float t0;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float t1_2;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float t1_7;
  float fVar89;
  float fVar90;
  float t1_3;
  float fVar91;
  float fVar92;
  float t1_1;
  float fVar93;
  float t1;
  float t1_4;
  float fVar94;
  CatmullClarkPatch patch;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_e38;
  vfloat_impl<4> **local_e30;
  undefined8 uStack_e28;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e20;
  size_t local_e10;
  undefined8 uStack_e08;
  float *local_e00;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *local_df0;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  float *local_dd0;
  FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_db0;
  CatmullClarkPatch local_d80;
  
  if (This.ptr == 0) {
    return false;
  }
  bVar40 = false;
  switch((uint)This.ptr & 0xf) {
  case 1:
    pfVar41 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar63 = *u;
    fVar79 = *v;
    pvVar3 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar3 != (vfloat_impl<4> *)0x0) {
      fVar72 = pfVar41[9];
      fVar70 = pfVar41[10];
      fVar71 = pfVar41[0xb];
      fVar66 = pfVar41[0xd];
      fVar83 = pfVar41[0xe];
      fVar86 = pfVar41[0xf];
      fVar59 = (pfVar41[4] - *pfVar41) * fVar63 + *pfVar41;
      fVar58 = (pfVar41[5] - pfVar41[1]) * fVar63 + pfVar41[1];
      fVar62 = (pfVar41[6] - pfVar41[2]) * fVar63 + pfVar41[2];
      fVar64 = (pfVar41[7] - pfVar41[3]) * fVar63 + pfVar41[3];
      (pvVar3->field_0).v[0] =
           (((pfVar41[8] - pfVar41[0xc]) * fVar63 + pfVar41[0xc]) - fVar59) * fVar79 + fVar59;
      (pvVar3->field_0).v[1] = (((fVar72 - fVar66) * fVar63 + fVar66) - fVar58) * fVar79 + fVar58;
      (pvVar3->field_0).v[2] = (((fVar70 - fVar83) * fVar63 + fVar83) - fVar62) * fVar79 + fVar62;
      (pvVar3->field_0).v[3] = (((fVar71 - fVar86) * fVar63 + fVar86) - fVar64) * fVar79 + fVar64;
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar72 = pfVar41[5];
      fVar70 = pfVar41[6];
      fVar71 = pfVar41[7];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar59 = pfVar41[1];
      fVar58 = pfVar41[2];
      fVar62 = pfVar41[3];
      fVar64 = pfVar41[0xd];
      fVar65 = pfVar41[0xe];
      fVar61 = pfVar41[0xf];
      (pvVar4->field_0).v[0] =
           (((pfVar41[8] - pfVar41[0xc]) - (pfVar41[4] - *pfVar41)) * fVar79 +
           (pfVar41[4] - *pfVar41)) * dscale;
      (pvVar4->field_0).v[1] =
           (((fVar66 - fVar64) - (fVar72 - fVar59)) * fVar79 + (fVar72 - fVar59)) * dscale;
      (pvVar4->field_0).v[2] =
           (((fVar83 - fVar65) - (fVar70 - fVar58)) * fVar79 + (fVar70 - fVar58)) * dscale;
      (pvVar4->field_0).v[3] =
           (((fVar86 - fVar61) - (fVar71 - fVar62)) * fVar79 + (fVar71 - fVar62)) * dscale;
      fVar79 = pfVar41[9];
      fVar72 = pfVar41[10];
      fVar70 = pfVar41[0xb];
      fVar71 = pfVar41[0xd];
      fVar66 = pfVar41[0xe];
      fVar83 = pfVar41[0xf];
      fVar86 = pfVar41[1];
      fVar59 = pfVar41[2];
      fVar58 = pfVar41[3];
      fVar62 = pfVar41[5];
      fVar64 = pfVar41[6];
      fVar65 = pfVar41[7];
      (pvVar5->field_0).v[0] =
           (((pfVar41[8] - pfVar41[4]) - (pfVar41[0xc] - *pfVar41)) * fVar63 +
           (pfVar41[0xc] - *pfVar41)) * dscale;
      (pvVar5->field_0).v[1] =
           (((fVar79 - fVar62) - (fVar71 - fVar86)) * fVar63 + (fVar71 - fVar86)) * dscale;
      (pvVar5->field_0).v[2] =
           (((fVar72 - fVar64) - (fVar66 - fVar59)) * fVar63 + (fVar66 - fVar59)) * dscale;
      (pvVar5->field_0).v[3] =
           (((fVar70 - fVar65) - (fVar83 - fVar58)) * fVar63 + (fVar83 - fVar58)) * dscale;
    }
    bVar40 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      fVar65 = dscale * dscale;
      fVar63 = fVar65 * 0.0;
      (pvVar6->field_0).v[0] = fVar63;
      (pvVar6->field_0).v[1] = fVar63;
      (pvVar6->field_0).v[2] = fVar63;
      (pvVar6->field_0).v[3] = fVar63;
      (pvVar7->field_0).v[0] = fVar63;
      (pvVar7->field_0).v[1] = fVar63;
      (pvVar7->field_0).v[2] = fVar63;
      (pvVar7->field_0).v[3] = fVar63;
      fVar63 = pfVar41[5];
      fVar79 = pfVar41[6];
      fVar72 = pfVar41[7];
      fVar70 = pfVar41[9];
      fVar71 = pfVar41[10];
      fVar66 = pfVar41[0xb];
      fVar83 = pfVar41[0xd];
      fVar86 = pfVar41[0xe];
      fVar59 = pfVar41[0xf];
      fVar58 = pfVar41[1];
      fVar62 = pfVar41[2];
      fVar64 = pfVar41[3];
      (pvVar8->field_0).v[0] = ((pfVar41[8] - pfVar41[0xc]) - (pfVar41[4] - *pfVar41)) * fVar65;
      (pvVar8->field_0).v[1] = ((fVar70 - fVar83) - (fVar63 - fVar58)) * fVar65;
      (pvVar8->field_0).v[2] = ((fVar71 - fVar86) - (fVar79 - fVar62)) * fVar65;
      (pvVar8->field_0).v[3] = ((fVar66 - fVar59) - (fVar72 - fVar64)) * fVar65;
    }
    break;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
              ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)
               (This.ptr & 0xfffffffffffffff0),*u,*v,this->P,this->dPdu,this->dPdv,this->ddPdudu,
               this->ddPdvdv,this->ddPdudv,dscale);
    goto LAB_00e24669;
  case 3:
    pfVar41 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar63 = *u;
    fVar79 = *v;
    pvVar3 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar3 != (vfloat_impl<4> *)0x0) {
      fVar72 = 1.0 - fVar63;
      fVar80 = fVar63 * fVar63 * fVar63;
      fVar56 = fVar63 * fVar63 * 3.0 * fVar72;
      fVar57 = fVar72 * fVar72 * fVar72;
      fVar84 = fVar63 * 3.0 * fVar72 * fVar72;
      fVar72 = 1.0 - fVar79;
      fVar52 = fVar79 * fVar79 * 3.0 * fVar72;
      fVar68 = fVar72 * fVar72 * fVar72;
      fVar69 = fVar79 * 3.0 * fVar72 * fVar72;
      fVar51 = fVar79 * fVar79 * fVar79;
      fVar72 = pfVar41[0xd];
      fVar70 = pfVar41[0xe];
      fVar71 = pfVar41[0xf];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar59 = pfVar41[5];
      fVar58 = pfVar41[6];
      fVar62 = pfVar41[7];
      fVar64 = pfVar41[1];
      fVar65 = pfVar41[2];
      fVar61 = pfVar41[3];
      fVar74 = pfVar41[0x1d];
      fVar76 = pfVar41[0x1e];
      fVar78 = pfVar41[0x1f];
      fVar73 = pfVar41[0x19];
      fVar55 = pfVar41[0x1a];
      fVar67 = pfVar41[0x1b];
      fVar75 = pfVar41[0x15];
      fVar13 = pfVar41[0x16];
      fVar14 = pfVar41[0x17];
      fVar15 = pfVar41[0x11];
      fVar16 = pfVar41[0x12];
      fVar17 = pfVar41[0x13];
      fVar18 = pfVar41[0x2d];
      fVar19 = pfVar41[0x2e];
      fVar20 = pfVar41[0x2f];
      fVar21 = pfVar41[0x29];
      fVar22 = pfVar41[0x2a];
      fVar23 = pfVar41[0x2b];
      fVar24 = pfVar41[0x25];
      fVar25 = pfVar41[0x26];
      fVar26 = pfVar41[0x27];
      fVar27 = pfVar41[0x21];
      fVar28 = pfVar41[0x22];
      fVar29 = pfVar41[0x23];
      fVar30 = pfVar41[0x3d];
      fVar31 = pfVar41[0x3e];
      fVar32 = pfVar41[0x3f];
      fVar33 = pfVar41[0x39];
      fVar34 = pfVar41[0x3a];
      fVar35 = pfVar41[0x3b];
      fVar36 = pfVar41[0x35];
      fVar37 = pfVar41[0x36];
      fVar38 = pfVar41[0x37];
      fVar39 = pfVar41[0x31];
      fVar60 = pfVar41[0x32];
      fVar50 = pfVar41[0x33];
      (pvVar3->field_0).v[0] =
           fVar51 * (fVar57 * pfVar41[0x30] +
                    fVar84 * pfVar41[0x34] + fVar56 * pfVar41[0x38] + fVar80 * pfVar41[0x3c]) +
           fVar52 * (pfVar41[0x20] * fVar57 +
                    pfVar41[0x24] * fVar84 + pfVar41[0x28] * fVar56 + pfVar41[0x2c] * fVar80) +
           fVar69 * (pfVar41[0x10] * fVar57 +
                    pfVar41[0x14] * fVar84 + pfVar41[0x18] * fVar56 + pfVar41[0x1c] * fVar80) +
           fVar68 * (*pfVar41 * fVar57 +
                    pfVar41[4] * fVar84 + pfVar41[8] * fVar56 + pfVar41[0xc] * fVar80);
      (pvVar3->field_0).v[1] =
           fVar51 * (fVar57 * fVar39 + fVar84 * fVar36 + fVar56 * fVar33 + fVar80 * fVar30) +
           fVar52 * (fVar27 * fVar57 + fVar24 * fVar84 + fVar21 * fVar56 + fVar18 * fVar80) +
           fVar69 * (fVar15 * fVar57 + fVar75 * fVar84 + fVar73 * fVar56 + fVar74 * fVar80) +
           fVar68 * (fVar64 * fVar57 + fVar59 * fVar84 + fVar66 * fVar56 + fVar72 * fVar80);
      (pvVar3->field_0).v[2] =
           fVar51 * (fVar57 * fVar60 + fVar84 * fVar37 + fVar56 * fVar34 + fVar80 * fVar31) +
           fVar52 * (fVar28 * fVar57 + fVar25 * fVar84 + fVar22 * fVar56 + fVar19 * fVar80) +
           fVar69 * (fVar16 * fVar57 + fVar13 * fVar84 + fVar55 * fVar56 + fVar76 * fVar80) +
           fVar68 * (fVar65 * fVar57 + fVar58 * fVar84 + fVar83 * fVar56 + fVar70 * fVar80);
      (pvVar3->field_0).v[3] =
           fVar51 * (fVar57 * fVar50 + fVar84 * fVar38 + fVar56 * fVar35 + fVar80 * fVar32) +
           fVar52 * (fVar29 * fVar57 + fVar26 * fVar84 + fVar23 * fVar56 + fVar20 * fVar80) +
           fVar69 * (fVar17 * fVar57 + fVar14 * fVar84 + fVar67 * fVar56 + fVar78 * fVar80) +
           fVar68 * (fVar61 * fVar57 + fVar62 * fVar84 + fVar86 * fVar56 + fVar71 * fVar80);
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar52 = 1.0 - fVar63;
      fVar77 = fVar63 * fVar63;
      fVar68 = fVar77 * 3.0;
      fVar69 = fVar68 * fVar52;
      fVar72 = fVar52 * fVar52;
      fVar70 = fVar63 * fVar52 + fVar63 * fVar52;
      fVar52 = fVar52 * fVar72;
      fVar91 = fVar63 * 3.0 * fVar72;
      fVar81 = fVar72 * -3.0;
      fVar51 = (fVar72 - fVar70) * 3.0;
      fVar89 = (fVar70 - fVar77) * 3.0;
      fVar87 = 1.0 - fVar79;
      fVar84 = fVar87 * fVar87;
      fVar72 = pfVar41[0xd];
      fVar70 = pfVar41[0xe];
      fVar71 = pfVar41[0xf];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar59 = pfVar41[5];
      fVar58 = pfVar41[6];
      fVar62 = pfVar41[7];
      fVar64 = pfVar41[1];
      fVar65 = pfVar41[2];
      fVar61 = pfVar41[3];
      fVar74 = pfVar41[0x1d];
      fVar76 = pfVar41[0x1e];
      fVar78 = pfVar41[0x1f];
      fVar73 = pfVar41[0x19];
      fVar55 = pfVar41[0x1a];
      fVar67 = pfVar41[0x1b];
      fVar75 = pfVar41[0x15];
      fVar13 = pfVar41[0x16];
      fVar14 = pfVar41[0x17];
      fVar15 = pfVar41[0x11];
      fVar16 = pfVar41[0x12];
      fVar17 = pfVar41[0x13];
      fVar18 = pfVar41[0x2d];
      fVar19 = pfVar41[0x2e];
      fVar20 = pfVar41[0x2f];
      fVar21 = pfVar41[0x29];
      fVar22 = pfVar41[0x2a];
      fVar23 = pfVar41[0x2b];
      fVar24 = pfVar41[0x25];
      fVar25 = pfVar41[0x26];
      fVar26 = pfVar41[0x27];
      fVar27 = pfVar41[0x21];
      fVar28 = pfVar41[0x22];
      fVar29 = pfVar41[0x23];
      fVar30 = pfVar41[0x3d];
      fVar31 = pfVar41[0x3e];
      fVar32 = pfVar41[0x3f];
      fVar33 = pfVar41[0x39];
      fVar34 = pfVar41[0x3a];
      fVar35 = pfVar41[0x3b];
      fVar88 = fVar87 * fVar84;
      fVar93 = fVar79 * 3.0 * fVar84;
      fVar36 = pfVar41[0x35];
      fVar37 = pfVar41[0x36];
      fVar38 = pfVar41[0x37];
      fVar57 = fVar79 * fVar79;
      fVar39 = pfVar41[0x31];
      fVar60 = pfVar41[0x32];
      fVar50 = pfVar41[0x33];
      fVar85 = fVar79 * fVar57;
      fVar56 = fVar87 * fVar79 + fVar87 * fVar79;
      fVar80 = fVar57 * 3.0;
      fVar87 = fVar87 * fVar80;
      (pvVar4->field_0).v[0] =
           (fVar85 * (fVar81 * pfVar41[0x30] +
                     fVar51 * pfVar41[0x34] + fVar89 * pfVar41[0x38] + fVar68 * pfVar41[0x3c]) +
            fVar87 * (pfVar41[0x20] * fVar81 +
                     pfVar41[0x24] * fVar51 + pfVar41[0x28] * fVar89 + pfVar41[0x2c] * fVar68) +
            fVar93 * (pfVar41[0x10] * fVar81 +
                     pfVar41[0x14] * fVar51 + pfVar41[0x18] * fVar89 + pfVar41[0x1c] * fVar68) +
           fVar88 * (*pfVar41 * fVar81 +
                    pfVar41[4] * fVar51 + pfVar41[8] * fVar89 + pfVar41[0xc] * fVar68)) * dscale;
      (pvVar4->field_0).v[1] =
           (fVar85 * (fVar81 * fVar39 + fVar51 * fVar36 + fVar89 * fVar33 + fVar68 * fVar30) +
            fVar87 * (fVar27 * fVar81 + fVar24 * fVar51 + fVar21 * fVar89 + fVar18 * fVar68) +
            fVar93 * (fVar15 * fVar81 + fVar75 * fVar51 + fVar73 * fVar89 + fVar74 * fVar68) +
           fVar88 * (fVar64 * fVar81 + fVar59 * fVar51 + fVar66 * fVar89 + fVar72 * fVar68)) *
           dscale;
      (pvVar4->field_0).v[2] =
           (fVar85 * (fVar81 * fVar60 + fVar51 * fVar37 + fVar89 * fVar34 + fVar68 * fVar31) +
            fVar87 * (fVar28 * fVar81 + fVar25 * fVar51 + fVar22 * fVar89 + fVar19 * fVar68) +
            fVar93 * (fVar16 * fVar81 + fVar13 * fVar51 + fVar55 * fVar89 + fVar76 * fVar68) +
           fVar88 * (fVar65 * fVar81 + fVar58 * fVar51 + fVar83 * fVar89 + fVar70 * fVar68)) *
           dscale;
      (pvVar4->field_0).v[3] =
           (fVar85 * (fVar81 * fVar50 + fVar51 * fVar38 + fVar89 * fVar35 + fVar68 * fVar32) +
            fVar87 * (fVar29 * fVar81 + fVar26 * fVar51 + fVar23 * fVar89 + fVar20 * fVar68) +
            fVar93 * (fVar17 * fVar81 + fVar14 * fVar51 + fVar67 * fVar89 + fVar78 * fVar68) +
           fVar88 * (fVar61 * fVar81 + fVar62 * fVar51 + fVar86 * fVar89 + fVar71 * fVar68)) *
           dscale;
      fVar77 = fVar77 * fVar63;
      fVar68 = fVar84 * -3.0;
      fVar51 = (fVar84 - fVar56) * 3.0;
      fVar57 = (fVar56 - fVar57) * 3.0;
      fVar72 = pfVar41[0xd];
      fVar70 = pfVar41[0xe];
      fVar71 = pfVar41[0xf];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar59 = pfVar41[5];
      fVar58 = pfVar41[6];
      fVar62 = pfVar41[7];
      fVar64 = pfVar41[1];
      fVar65 = pfVar41[2];
      fVar61 = pfVar41[3];
      fVar74 = pfVar41[0x1d];
      fVar76 = pfVar41[0x1e];
      fVar78 = pfVar41[0x1f];
      fVar73 = pfVar41[0x19];
      fVar55 = pfVar41[0x1a];
      fVar67 = pfVar41[0x1b];
      fVar75 = pfVar41[0x15];
      fVar13 = pfVar41[0x16];
      fVar14 = pfVar41[0x17];
      fVar15 = pfVar41[0x11];
      fVar16 = pfVar41[0x12];
      fVar17 = pfVar41[0x13];
      fVar18 = pfVar41[0x2d];
      fVar19 = pfVar41[0x2e];
      fVar20 = pfVar41[0x2f];
      fVar21 = pfVar41[0x29];
      fVar22 = pfVar41[0x2a];
      fVar23 = pfVar41[0x2b];
      fVar24 = pfVar41[0x25];
      fVar25 = pfVar41[0x26];
      fVar26 = pfVar41[0x27];
      fVar27 = pfVar41[0x21];
      fVar28 = pfVar41[0x22];
      fVar29 = pfVar41[0x23];
      fVar30 = pfVar41[0x3d];
      fVar31 = pfVar41[0x3e];
      fVar32 = pfVar41[0x3f];
      fVar33 = pfVar41[0x39];
      fVar34 = pfVar41[0x3a];
      fVar35 = pfVar41[0x3b];
      fVar36 = pfVar41[0x35];
      fVar37 = pfVar41[0x36];
      fVar38 = pfVar41[0x37];
      fVar39 = pfVar41[0x31];
      fVar60 = pfVar41[0x32];
      fVar50 = pfVar41[0x33];
      (pvVar5->field_0).v[0] =
           (fVar80 * (fVar52 * pfVar41[0x30] +
                     fVar91 * pfVar41[0x34] + fVar69 * pfVar41[0x38] + fVar77 * pfVar41[0x3c]) +
            fVar57 * (pfVar41[0x20] * fVar52 +
                     pfVar41[0x24] * fVar91 + pfVar41[0x28] * fVar69 + pfVar41[0x2c] * fVar77) +
            fVar51 * (pfVar41[0x10] * fVar52 +
                     pfVar41[0x14] * fVar91 + pfVar41[0x18] * fVar69 + pfVar41[0x1c] * fVar77) +
           fVar68 * (*pfVar41 * fVar52 +
                    pfVar41[4] * fVar91 + pfVar41[8] * fVar69 + pfVar41[0xc] * fVar77)) * dscale;
      (pvVar5->field_0).v[1] =
           (fVar80 * (fVar52 * fVar39 + fVar91 * fVar36 + fVar69 * fVar33 + fVar77 * fVar30) +
            fVar57 * (fVar27 * fVar52 + fVar24 * fVar91 + fVar21 * fVar69 + fVar18 * fVar77) +
            fVar51 * (fVar15 * fVar52 + fVar75 * fVar91 + fVar73 * fVar69 + fVar74 * fVar77) +
           fVar68 * (fVar64 * fVar52 + fVar59 * fVar91 + fVar66 * fVar69 + fVar72 * fVar77)) *
           dscale;
      (pvVar5->field_0).v[2] =
           (fVar80 * (fVar52 * fVar60 + fVar91 * fVar37 + fVar69 * fVar34 + fVar77 * fVar31) +
            fVar57 * (fVar28 * fVar52 + fVar25 * fVar91 + fVar22 * fVar69 + fVar19 * fVar77) +
            fVar51 * (fVar16 * fVar52 + fVar13 * fVar91 + fVar55 * fVar69 + fVar76 * fVar77) +
           fVar68 * (fVar65 * fVar52 + fVar58 * fVar91 + fVar83 * fVar69 + fVar70 * fVar77)) *
           dscale;
      (pvVar5->field_0).v[3] =
           (fVar80 * (fVar52 * fVar50 + fVar91 * fVar38 + fVar69 * fVar35 + fVar77 * fVar32) +
            fVar57 * (fVar29 * fVar52 + fVar26 * fVar91 + fVar23 * fVar69 + fVar20 * fVar77) +
            fVar51 * (fVar17 * fVar52 + fVar14 * fVar91 + fVar67 * fVar69 + fVar78 * fVar77) +
           fVar68 * (fVar61 * fVar52 + fVar62 * fVar91 + fVar86 * fVar69 + fVar71 * fVar77)) *
           dscale;
    }
    bVar40 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      fVar80 = 1.0 - fVar63;
      fVar84 = fVar80 * 6.0;
      fVar52 = (fVar63 - (fVar80 + fVar80)) * 6.0;
      fVar69 = (fVar80 - (fVar63 + fVar63)) * 6.0;
      fVar91 = fVar63 * 6.0;
      fVar87 = 1.0 - fVar79;
      fVar51 = fVar87 * fVar87;
      fVar89 = fVar87 * fVar51;
      fVar72 = pfVar41[0xd];
      fVar70 = pfVar41[0xe];
      fVar71 = pfVar41[0xf];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar59 = pfVar41[5];
      fVar58 = pfVar41[6];
      fVar62 = pfVar41[7];
      fVar64 = pfVar41[1];
      fVar65 = pfVar41[2];
      fVar61 = pfVar41[3];
      fVar74 = pfVar41[0x1d];
      fVar76 = pfVar41[0x1e];
      fVar78 = pfVar41[0x1f];
      fVar73 = pfVar41[0x19];
      fVar55 = pfVar41[0x1a];
      fVar67 = pfVar41[0x1b];
      fVar75 = pfVar41[0x15];
      fVar13 = pfVar41[0x16];
      fVar14 = pfVar41[0x17];
      fVar15 = pfVar41[0x11];
      fVar16 = pfVar41[0x12];
      fVar17 = pfVar41[0x13];
      fVar18 = pfVar41[0x2d];
      fVar19 = pfVar41[0x2e];
      fVar20 = pfVar41[0x2f];
      fVar21 = pfVar41[0x29];
      fVar22 = pfVar41[0x2a];
      fVar23 = pfVar41[0x2b];
      fVar24 = pfVar41[0x25];
      fVar25 = pfVar41[0x26];
      fVar26 = pfVar41[0x27];
      fVar27 = pfVar41[0x21];
      fVar28 = pfVar41[0x22];
      fVar29 = pfVar41[0x23];
      fVar30 = pfVar41[0x3d];
      fVar31 = pfVar41[0x3e];
      fVar32 = pfVar41[0x3f];
      fVar33 = pfVar41[0x39];
      fVar34 = pfVar41[0x3a];
      fVar35 = pfVar41[0x3b];
      fVar81 = fVar79 * 3.0 * fVar51;
      fVar36 = pfVar41[0x35];
      fVar37 = pfVar41[0x36];
      fVar38 = pfVar41[0x37];
      fVar93 = fVar79 * fVar79;
      fVar39 = pfVar41[0x31];
      fVar60 = pfVar41[0x32];
      fVar50 = pfVar41[0x33];
      fVar85 = fVar79 * fVar93;
      fVar56 = fVar87 * fVar79 + fVar87 * fVar79;
      fVar77 = fVar93 * 3.0;
      fVar57 = fVar87 * fVar77;
      fVar68 = dscale * dscale;
      (pvVar6->field_0).v[0] =
           (fVar85 * (fVar84 * pfVar41[0x30] +
                     fVar52 * pfVar41[0x34] + fVar69 * pfVar41[0x38] + fVar91 * pfVar41[0x3c]) +
            fVar57 * (pfVar41[0x20] * fVar84 +
                     pfVar41[0x24] * fVar52 + pfVar41[0x28] * fVar69 + pfVar41[0x2c] * fVar91) +
            fVar81 * (pfVar41[0x10] * fVar84 +
                     pfVar41[0x14] * fVar52 + pfVar41[0x18] * fVar69 + pfVar41[0x1c] * fVar91) +
           fVar89 * (*pfVar41 * fVar84 +
                    pfVar41[4] * fVar52 + pfVar41[8] * fVar69 + pfVar41[0xc] * fVar91)) * fVar68;
      (pvVar6->field_0).v[1] =
           (fVar85 * (fVar84 * fVar39 + fVar52 * fVar36 + fVar69 * fVar33 + fVar91 * fVar30) +
            fVar57 * (fVar27 * fVar84 + fVar24 * fVar52 + fVar21 * fVar69 + fVar18 * fVar91) +
            fVar81 * (fVar15 * fVar84 + fVar75 * fVar52 + fVar73 * fVar69 + fVar74 * fVar91) +
           fVar89 * (fVar64 * fVar84 + fVar59 * fVar52 + fVar66 * fVar69 + fVar72 * fVar91)) *
           fVar68;
      (pvVar6->field_0).v[2] =
           (fVar85 * (fVar84 * fVar60 + fVar52 * fVar37 + fVar69 * fVar34 + fVar91 * fVar31) +
            fVar57 * (fVar28 * fVar84 + fVar25 * fVar52 + fVar22 * fVar69 + fVar19 * fVar91) +
            fVar81 * (fVar16 * fVar84 + fVar13 * fVar52 + fVar55 * fVar69 + fVar76 * fVar91) +
           fVar89 * (fVar65 * fVar84 + fVar58 * fVar52 + fVar83 * fVar69 + fVar70 * fVar91)) *
           fVar68;
      (pvVar6->field_0).v[3] =
           (fVar85 * (fVar84 * fVar50 + fVar52 * fVar38 + fVar69 * fVar35 + fVar91 * fVar32) +
            fVar57 * (fVar29 * fVar84 + fVar26 * fVar52 + fVar23 * fVar69 + fVar20 * fVar91) +
            fVar81 * (fVar17 * fVar84 + fVar14 * fVar52 + fVar67 * fVar69 + fVar78 * fVar91) +
           fVar89 * (fVar61 * fVar84 + fVar62 * fVar52 + fVar86 * fVar69 + fVar71 * fVar91)) *
           fVar68;
      fVar89 = fVar80 * fVar80;
      fVar57 = fVar63 * fVar63;
      fVar50 = fVar87 * 6.0;
      fVar84 = (fVar79 - (fVar87 + fVar87)) * 6.0;
      fVar87 = (fVar87 - (fVar79 + fVar79)) * 6.0;
      fVar79 = fVar79 * 6.0;
      fVar85 = fVar63 * fVar57;
      fVar91 = fVar80 * fVar63 + fVar80 * fVar63;
      fVar69 = fVar57 * 3.0;
      fVar81 = fVar80 * fVar69;
      fVar72 = pfVar41[0xd];
      fVar70 = pfVar41[0xe];
      fVar71 = pfVar41[0xf];
      fVar66 = pfVar41[9];
      fVar83 = pfVar41[10];
      fVar86 = pfVar41[0xb];
      fVar52 = fVar63 * 3.0 * fVar89;
      fVar63 = pfVar41[5];
      fVar59 = pfVar41[6];
      fVar58 = pfVar41[7];
      fVar80 = fVar80 * fVar89;
      fVar62 = pfVar41[1];
      fVar64 = pfVar41[2];
      fVar65 = pfVar41[3];
      fVar61 = pfVar41[0x1d];
      fVar74 = pfVar41[0x1e];
      fVar76 = pfVar41[0x1f];
      fVar78 = pfVar41[0x19];
      fVar73 = pfVar41[0x1a];
      fVar55 = pfVar41[0x1b];
      fVar67 = pfVar41[0x15];
      fVar75 = pfVar41[0x16];
      fVar13 = pfVar41[0x17];
      fVar14 = pfVar41[0x11];
      fVar15 = pfVar41[0x12];
      fVar16 = pfVar41[0x13];
      fVar17 = pfVar41[0x2d];
      fVar18 = pfVar41[0x2e];
      fVar19 = pfVar41[0x2f];
      fVar20 = pfVar41[0x29];
      fVar21 = pfVar41[0x2a];
      fVar22 = pfVar41[0x2b];
      fVar23 = pfVar41[0x25];
      fVar24 = pfVar41[0x26];
      fVar25 = pfVar41[0x27];
      fVar26 = pfVar41[0x21];
      fVar27 = pfVar41[0x22];
      fVar28 = pfVar41[0x23];
      fVar29 = pfVar41[0x3d];
      fVar30 = pfVar41[0x3e];
      fVar31 = pfVar41[0x3f];
      fVar32 = pfVar41[0x39];
      fVar33 = pfVar41[0x3a];
      fVar34 = pfVar41[0x3b];
      fVar35 = pfVar41[0x35];
      fVar36 = pfVar41[0x36];
      fVar37 = pfVar41[0x37];
      fVar38 = pfVar41[0x31];
      fVar39 = pfVar41[0x32];
      fVar60 = pfVar41[0x33];
      (pvVar7->field_0).v[0] =
           (fVar79 * (fVar80 * pfVar41[0x30] +
                     fVar52 * pfVar41[0x34] + fVar81 * pfVar41[0x38] + fVar85 * pfVar41[0x3c]) +
            fVar87 * (pfVar41[0x20] * fVar80 +
                     pfVar41[0x24] * fVar52 + pfVar41[0x28] * fVar81 + pfVar41[0x2c] * fVar85) +
            fVar84 * (pfVar41[0x10] * fVar80 +
                     pfVar41[0x14] * fVar52 + pfVar41[0x18] * fVar81 + pfVar41[0x1c] * fVar85) +
           fVar50 * (*pfVar41 * fVar80 +
                    pfVar41[4] * fVar52 + pfVar41[8] * fVar81 + pfVar41[0xc] * fVar85)) * fVar68;
      (pvVar7->field_0).v[1] =
           (fVar79 * (fVar80 * fVar38 + fVar52 * fVar35 + fVar81 * fVar32 + fVar85 * fVar29) +
            fVar87 * (fVar26 * fVar80 + fVar23 * fVar52 + fVar20 * fVar81 + fVar17 * fVar85) +
            fVar84 * (fVar14 * fVar80 + fVar67 * fVar52 + fVar78 * fVar81 + fVar61 * fVar85) +
           fVar50 * (fVar62 * fVar80 + fVar63 * fVar52 + fVar66 * fVar81 + fVar72 * fVar85)) *
           fVar68;
      (pvVar7->field_0).v[2] =
           (fVar79 * (fVar80 * fVar39 + fVar52 * fVar36 + fVar81 * fVar33 + fVar85 * fVar30) +
            fVar87 * (fVar27 * fVar80 + fVar24 * fVar52 + fVar21 * fVar81 + fVar18 * fVar85) +
            fVar84 * (fVar15 * fVar80 + fVar75 * fVar52 + fVar73 * fVar81 + fVar74 * fVar85) +
           fVar50 * (fVar64 * fVar80 + fVar59 * fVar52 + fVar83 * fVar81 + fVar70 * fVar85)) *
           fVar68;
      (pvVar7->field_0).v[3] =
           (fVar79 * (fVar80 * fVar60 + fVar52 * fVar37 + fVar81 * fVar34 + fVar85 * fVar31) +
            fVar87 * (fVar28 * fVar80 + fVar25 * fVar52 + fVar22 * fVar81 + fVar19 * fVar85) +
            fVar84 * (fVar16 * fVar80 + fVar13 * fVar52 + fVar55 * fVar81 + fVar76 * fVar85) +
           fVar50 * (fVar65 * fVar80 + fVar58 * fVar52 + fVar86 * fVar81 + fVar71 * fVar85)) *
           fVar68;
      fVar80 = fVar89 * -3.0;
      fVar50 = (fVar89 - fVar91) * 3.0;
      fVar57 = (fVar91 - fVar57) * 3.0;
      fVar60 = fVar51 * -3.0;
      fVar51 = (fVar51 - fVar56) * 3.0;
      fVar52 = (fVar56 - fVar93) * 3.0;
      fVar63 = pfVar41[0xd];
      fVar79 = pfVar41[0xe];
      fVar72 = pfVar41[0xf];
      fVar70 = pfVar41[9];
      fVar71 = pfVar41[10];
      fVar66 = pfVar41[0xb];
      fVar83 = pfVar41[5];
      fVar86 = pfVar41[6];
      fVar59 = pfVar41[7];
      fVar58 = pfVar41[1];
      fVar62 = pfVar41[2];
      fVar64 = pfVar41[3];
      fVar65 = pfVar41[0x1d];
      fVar61 = pfVar41[0x1e];
      fVar74 = pfVar41[0x1f];
      fVar76 = pfVar41[0x19];
      fVar78 = pfVar41[0x1a];
      fVar73 = pfVar41[0x1b];
      fVar55 = pfVar41[0x15];
      fVar67 = pfVar41[0x16];
      fVar75 = pfVar41[0x17];
      fVar13 = pfVar41[0x11];
      fVar14 = pfVar41[0x12];
      fVar15 = pfVar41[0x13];
      fVar16 = pfVar41[0x2d];
      fVar17 = pfVar41[0x2e];
      fVar18 = pfVar41[0x2f];
      fVar19 = pfVar41[0x29];
      fVar20 = pfVar41[0x2a];
      fVar21 = pfVar41[0x2b];
      fVar22 = pfVar41[0x25];
      fVar23 = pfVar41[0x26];
      fVar24 = pfVar41[0x27];
      fVar25 = pfVar41[0x21];
      fVar26 = pfVar41[0x22];
      fVar27 = pfVar41[0x23];
      fVar28 = pfVar41[0x3d];
      fVar29 = pfVar41[0x3e];
      fVar30 = pfVar41[0x3f];
      fVar31 = pfVar41[0x39];
      fVar32 = pfVar41[0x3a];
      fVar33 = pfVar41[0x3b];
      fVar34 = pfVar41[0x35];
      fVar35 = pfVar41[0x36];
      fVar36 = pfVar41[0x37];
      fVar37 = pfVar41[0x31];
      fVar38 = pfVar41[0x32];
      fVar39 = pfVar41[0x33];
      (pvVar8->field_0).v[0] =
           (fVar77 * (fVar80 * pfVar41[0x30] +
                     fVar50 * pfVar41[0x34] + fVar57 * pfVar41[0x38] + fVar69 * pfVar41[0x3c]) +
            fVar52 * (pfVar41[0x20] * fVar80 +
                     pfVar41[0x24] * fVar50 + pfVar41[0x28] * fVar57 + pfVar41[0x2c] * fVar69) +
            fVar51 * (pfVar41[0x10] * fVar80 +
                     pfVar41[0x14] * fVar50 + pfVar41[0x18] * fVar57 + pfVar41[0x1c] * fVar69) +
           fVar60 * (*pfVar41 * fVar80 +
                    pfVar41[4] * fVar50 + pfVar41[8] * fVar57 + pfVar41[0xc] * fVar69)) * fVar68;
      (pvVar8->field_0).v[1] =
           (fVar77 * (fVar80 * fVar37 + fVar50 * fVar34 + fVar57 * fVar31 + fVar69 * fVar28) +
            fVar52 * (fVar25 * fVar80 + fVar22 * fVar50 + fVar19 * fVar57 + fVar16 * fVar69) +
            fVar51 * (fVar13 * fVar80 + fVar55 * fVar50 + fVar76 * fVar57 + fVar65 * fVar69) +
           fVar60 * (fVar58 * fVar80 + fVar83 * fVar50 + fVar70 * fVar57 + fVar63 * fVar69)) *
           fVar68;
      (pvVar8->field_0).v[2] =
           (fVar77 * (fVar80 * fVar38 + fVar50 * fVar35 + fVar57 * fVar32 + fVar69 * fVar29) +
            fVar52 * (fVar26 * fVar80 + fVar23 * fVar50 + fVar20 * fVar57 + fVar17 * fVar69) +
            fVar51 * (fVar14 * fVar80 + fVar67 * fVar50 + fVar78 * fVar57 + fVar61 * fVar69) +
           fVar60 * (fVar62 * fVar80 + fVar86 * fVar50 + fVar71 * fVar57 + fVar79 * fVar69)) *
           fVar68;
      (pvVar8->field_0).v[3] =
           (fVar77 * (fVar80 * fVar39 + fVar50 * fVar36 + fVar57 * fVar33 + fVar69 * fVar30) +
            fVar52 * (fVar27 * fVar80 + fVar24 * fVar50 + fVar21 * fVar57 + fVar18 * fVar69) +
            fVar51 * (fVar15 * fVar80 + fVar75 * fVar50 + fVar73 * fVar57 + fVar74 * fVar69) +
           fVar60 * (fVar64 * fVar80 + fVar59 * fVar50 + fVar66 * fVar57 + fVar72 * fVar69)) *
           fVar68;
    }
    break;
  case 4:
    pfVar41 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar63 = *u;
    fVar79 = *v;
    pvVar3 = this->P;
    pvVar4 = this->dPdu;
    pvVar5 = this->dPdv;
    pvVar6 = this->ddPdudu;
    pvVar7 = this->ddPdvdv;
    pvVar8 = this->ddPdudv;
    if (pvVar3 != (vfloat_impl<4> *)0x0) {
      if (((((fVar79 == 1.0) && (!NAN(fVar79))) || ((fVar63 == 0.0 && (!NAN(fVar63))))) ||
          ((fVar63 == 1.0 && (!NAN(fVar63))))) || ((fVar79 == 0.0 && (!NAN(fVar79))))) {
        fVar62 = pfVar41[0x14];
        fVar64 = pfVar41[0x15];
        fVar65 = pfVar41[0x16];
        fVar61 = pfVar41[0x17];
        fVar72 = pfVar41[0x18];
        fVar70 = pfVar41[0x19];
        fVar71 = pfVar41[0x1a];
        fVar66 = pfVar41[0x1b];
        fVar83 = pfVar41[0x24];
        fVar86 = pfVar41[0x25];
        fVar59 = pfVar41[0x26];
        fVar58 = pfVar41[0x27];
        fVar74 = pfVar41[0x28];
        fVar76 = pfVar41[0x29];
        fVar78 = pfVar41[0x2a];
        fVar73 = pfVar41[0x2b];
      }
      else {
        fVar72 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
        fVar61 = (2.0 - fVar72 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = fVar61 * (pfVar41[0x40] * fVar79 + pfVar41[0x14] * fVar63);
        fVar64 = fVar61 * (pfVar41[0x41] * fVar79 + pfVar41[0x15] * fVar63);
        fVar65 = fVar61 * (pfVar41[0x42] * fVar79 + pfVar41[0x16] * fVar63);
        fVar61 = fVar61 * (pfVar41[0x43] * fVar79 + pfVar41[0x17] * fVar63);
        fVar83 = 1.0 - fVar63;
        fVar72 = fVar83 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar72),ZEXT416((uint)fVar72));
        fVar66 = (2.0 - fVar72 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar66 * (fVar79 * pfVar41[0x18] + pfVar41[0x44] * fVar83);
        fVar70 = fVar66 * (fVar79 * pfVar41[0x19] + pfVar41[0x45] * fVar83);
        fVar71 = fVar66 * (fVar79 * pfVar41[0x1a] + pfVar41[0x46] * fVar83);
        fVar66 = fVar66 * (fVar79 * pfVar41[0x1b] + pfVar41[0x47] * fVar83);
        fVar55 = 1.0 - fVar79;
        fVar86 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar86),ZEXT416((uint)fVar86));
        fVar73 = (2.0 - fVar86 * auVar82._0_4_) * auVar82._0_4_;
        fVar74 = fVar73 * (pfVar41[0x4c] * fVar55 + fVar83 * pfVar41[0x28]);
        fVar76 = fVar73 * (pfVar41[0x4d] * fVar55 + fVar83 * pfVar41[0x29]);
        fVar78 = fVar73 * (pfVar41[0x4e] * fVar55 + fVar83 * pfVar41[0x2a]);
        fVar73 = fVar73 * (pfVar41[0x4f] * fVar55 + fVar83 * pfVar41[0x2b]);
        fVar83 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83));
        fVar58 = (2.0 - fVar83 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar58 * (fVar55 * pfVar41[0x24] + fVar63 * pfVar41[0x48]);
        fVar86 = fVar58 * (fVar55 * pfVar41[0x25] + fVar63 * pfVar41[0x49]);
        fVar59 = fVar58 * (fVar55 * pfVar41[0x26] + fVar63 * pfVar41[0x4a]);
        fVar58 = fVar58 * (fVar55 * pfVar41[0x27] + fVar63 * pfVar41[0x4b]);
      }
      fVar55 = 1.0 - fVar63;
      fVar89 = fVar63 * fVar63 * fVar63;
      fVar51 = fVar63 * fVar63 * 3.0 * fVar55;
      fVar80 = fVar55 * fVar55 * fVar55;
      fVar87 = fVar63 * 3.0 * fVar55 * fVar55;
      fVar55 = 1.0 - fVar79;
      fVar84 = fVar79 * fVar79 * 3.0 * fVar55;
      fVar93 = fVar55 * fVar55 * fVar55;
      fVar56 = fVar79 * 3.0 * fVar55 * fVar55;
      fVar91 = fVar79 * fVar79 * fVar79;
      fVar55 = pfVar41[0xd];
      fVar67 = pfVar41[0xe];
      fVar75 = pfVar41[0xf];
      fVar13 = pfVar41[9];
      fVar14 = pfVar41[10];
      fVar15 = pfVar41[0xb];
      fVar16 = pfVar41[5];
      fVar17 = pfVar41[6];
      fVar18 = pfVar41[7];
      fVar19 = pfVar41[1];
      fVar20 = pfVar41[2];
      fVar21 = pfVar41[3];
      fVar22 = pfVar41[0x1d];
      fVar23 = pfVar41[0x1e];
      fVar24 = pfVar41[0x1f];
      fVar25 = pfVar41[0x11];
      fVar26 = pfVar41[0x12];
      fVar27 = pfVar41[0x13];
      fVar28 = pfVar41[0x2d];
      fVar29 = pfVar41[0x2e];
      fVar30 = pfVar41[0x2f];
      fVar31 = pfVar41[0x21];
      fVar32 = pfVar41[0x22];
      fVar33 = pfVar41[0x23];
      fVar34 = pfVar41[0x3d];
      fVar35 = pfVar41[0x3e];
      fVar36 = pfVar41[0x3f];
      fVar37 = pfVar41[0x39];
      fVar38 = pfVar41[0x3a];
      fVar39 = pfVar41[0x3b];
      fVar60 = pfVar41[0x35];
      fVar50 = pfVar41[0x36];
      fVar52 = pfVar41[0x37];
      fVar57 = pfVar41[0x31];
      fVar68 = pfVar41[0x32];
      fVar69 = pfVar41[0x33];
      (pvVar3->field_0).v[0] =
           fVar91 * (fVar80 * pfVar41[0x30] +
                    fVar87 * pfVar41[0x34] + fVar51 * pfVar41[0x38] + fVar89 * pfVar41[0x3c]) +
           (pfVar41[0x20] * fVar80 + fVar83 * fVar87 + fVar74 * fVar51 + pfVar41[0x2c] * fVar89) *
           fVar84 + (pfVar41[0x10] * fVar80 +
                    fVar62 * fVar87 + fVar72 * fVar51 + pfVar41[0x1c] * fVar89) * fVar56 +
           (*pfVar41 * fVar80 + pfVar41[4] * fVar87 + pfVar41[8] * fVar51 + pfVar41[0xc] * fVar89) *
           fVar93;
      (pvVar3->field_0).v[1] =
           fVar91 * (fVar80 * fVar57 + fVar87 * fVar60 + fVar51 * fVar37 + fVar89 * fVar34) +
           (fVar31 * fVar80 + fVar86 * fVar87 + fVar76 * fVar51 + fVar28 * fVar89) * fVar84 +
           (fVar25 * fVar80 + fVar64 * fVar87 + fVar70 * fVar51 + fVar22 * fVar89) * fVar56 +
           (fVar19 * fVar80 + fVar16 * fVar87 + fVar13 * fVar51 + fVar55 * fVar89) * fVar93;
      (pvVar3->field_0).v[2] =
           fVar91 * (fVar80 * fVar68 + fVar87 * fVar50 + fVar51 * fVar38 + fVar89 * fVar35) +
           (fVar32 * fVar80 + fVar59 * fVar87 + fVar78 * fVar51 + fVar29 * fVar89) * fVar84 +
           (fVar26 * fVar80 + fVar65 * fVar87 + fVar71 * fVar51 + fVar23 * fVar89) * fVar56 +
           (fVar20 * fVar80 + fVar17 * fVar87 + fVar14 * fVar51 + fVar67 * fVar89) * fVar93;
      (pvVar3->field_0).v[3] =
           fVar91 * (fVar80 * fVar69 + fVar87 * fVar52 + fVar51 * fVar39 + fVar89 * fVar36) +
           (fVar33 * fVar80 + fVar58 * fVar87 + fVar73 * fVar51 + fVar30 * fVar89) * fVar84 +
           (fVar27 * fVar80 + fVar61 * fVar87 + fVar66 * fVar51 + fVar24 * fVar89) * fVar56 +
           (fVar21 * fVar80 + fVar18 * fVar87 + fVar15 * fVar51 + fVar75 * fVar89) * fVar93;
    }
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar72 = pfVar41[0x14];
      fVar70 = pfVar41[0x15];
      fVar71 = pfVar41[0x16];
      fVar66 = pfVar41[0x17];
      fVar83 = pfVar41[0x18];
      fVar86 = pfVar41[0x19];
      fVar59 = pfVar41[0x1a];
      fVar58 = pfVar41[0x1b];
      fVar62 = pfVar41[0x24];
      fVar64 = pfVar41[0x25];
      fVar65 = pfVar41[0x26];
      fVar61 = pfVar41[0x27];
      fVar74 = pfVar41[0x28];
      fVar76 = pfVar41[0x29];
      fVar78 = pfVar41[0x2a];
      fVar73 = pfVar41[0x2b];
      if ((fVar79 != 1.0 && fVar79 != 0.0) && (fVar63 != 0.0 && fVar63 != 1.0)) {
        fVar55 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar67 = 1.0 - fVar79;
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar55 * (pfVar41[0x40] * fVar79 + fVar72 * fVar63);
        fVar70 = fVar55 * (pfVar41[0x41] * fVar79 + fVar70 * fVar63);
        fVar71 = fVar55 * (pfVar41[0x42] * fVar79 + fVar71 * fVar63);
        fVar66 = fVar55 * (pfVar41[0x43] * fVar79 + fVar66 * fVar63);
        fVar75 = 1.0 - fVar63;
        fVar55 = fVar75 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar55 * (fVar79 * fVar83 + pfVar41[0x44] * fVar75);
        fVar86 = fVar55 * (fVar79 * fVar86 + pfVar41[0x45] * fVar75);
        fVar59 = fVar55 * (fVar79 * fVar59 + pfVar41[0x46] * fVar75);
        fVar58 = fVar55 * (fVar79 * fVar58 + pfVar41[0x47] * fVar75);
        fVar55 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar74 = fVar55 * (pfVar41[0x4c] * fVar67 + fVar75 * fVar74);
        fVar76 = fVar55 * (pfVar41[0x4d] * fVar67 + fVar75 * fVar76);
        fVar78 = fVar55 * (pfVar41[0x4e] * fVar67 + fVar75 * fVar78);
        fVar73 = fVar55 * (pfVar41[0x4f] * fVar67 + fVar75 * fVar73);
        fVar55 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = fVar55 * (fVar67 * fVar62 + fVar63 * pfVar41[0x48]);
        fVar64 = fVar55 * (fVar67 * fVar64 + fVar63 * pfVar41[0x49]);
        fVar65 = fVar55 * (fVar67 * fVar65 + fVar63 * pfVar41[0x4a]);
        fVar61 = fVar55 * (fVar67 * fVar61 + fVar63 * pfVar41[0x4b]);
      }
      fVar51 = 1.0 - fVar63;
      fVar80 = fVar51 * fVar51;
      fVar55 = fVar63 * fVar51 + fVar63 * fVar51;
      fVar91 = fVar63 * fVar63;
      fVar90 = fVar80 * -3.0;
      fVar88 = (fVar80 - fVar55) * 3.0;
      fVar94 = (fVar55 - fVar91) * 3.0;
      fVar89 = fVar91 * 3.0;
      fVar87 = fVar79 * fVar79;
      fVar55 = pfVar41[0xd];
      fVar67 = pfVar41[0xe];
      fVar75 = pfVar41[0xf];
      fVar13 = pfVar41[9];
      fVar14 = pfVar41[10];
      fVar15 = pfVar41[0xb];
      fVar16 = pfVar41[5];
      fVar17 = pfVar41[6];
      fVar18 = pfVar41[7];
      fVar19 = pfVar41[1];
      fVar20 = pfVar41[2];
      fVar21 = pfVar41[3];
      fVar85 = 1.0 - fVar79;
      fVar56 = fVar85 * fVar85;
      fVar84 = fVar85 * fVar56;
      fVar22 = pfVar41[0x1d];
      fVar23 = pfVar41[0x1e];
      fVar24 = pfVar41[0x1f];
      fVar25 = pfVar41[0x11];
      fVar26 = pfVar41[0x12];
      fVar27 = pfVar41[0x13];
      fVar81 = fVar79 * 3.0 * fVar56;
      fVar28 = pfVar41[0x2d];
      fVar29 = pfVar41[0x2e];
      fVar30 = pfVar41[0x2f];
      fVar77 = fVar87 * 3.0;
      fVar31 = pfVar41[0x21];
      fVar32 = pfVar41[0x22];
      fVar33 = pfVar41[0x23];
      fVar92 = fVar85 * fVar77;
      fVar34 = pfVar41[0x3d];
      fVar35 = pfVar41[0x3e];
      fVar36 = pfVar41[0x3f];
      fVar37 = pfVar41[0x39];
      fVar38 = pfVar41[0x3a];
      fVar39 = pfVar41[0x3b];
      fVar60 = pfVar41[0x35];
      fVar50 = pfVar41[0x36];
      fVar52 = pfVar41[0x37];
      fVar57 = pfVar41[0x31];
      fVar68 = pfVar41[0x32];
      fVar69 = pfVar41[0x33];
      fVar93 = fVar79 * fVar87;
      (pvVar4->field_0).v[0] =
           (fVar93 * (fVar90 * pfVar41[0x30] +
                     fVar88 * pfVar41[0x34] + fVar94 * pfVar41[0x38] + fVar89 * pfVar41[0x3c]) +
            (pfVar41[0x20] * fVar90 + fVar62 * fVar88 + fVar74 * fVar94 + pfVar41[0x2c] * fVar89) *
            fVar92 + (pfVar41[0x10] * fVar90 +
                     fVar72 * fVar88 + fVar83 * fVar94 + pfVar41[0x1c] * fVar89) * fVar81 +
           (*pfVar41 * fVar90 + pfVar41[4] * fVar88 + pfVar41[8] * fVar94 + pfVar41[0xc] * fVar89) *
           fVar84) * dscale;
      (pvVar4->field_0).v[1] =
           (fVar93 * (fVar90 * fVar57 + fVar88 * fVar60 + fVar94 * fVar37 + fVar89 * fVar34) +
            (fVar31 * fVar90 + fVar64 * fVar88 + fVar76 * fVar94 + fVar28 * fVar89) * fVar92 +
            (fVar25 * fVar90 + fVar70 * fVar88 + fVar86 * fVar94 + fVar22 * fVar89) * fVar81 +
           (fVar19 * fVar90 + fVar16 * fVar88 + fVar13 * fVar94 + fVar55 * fVar89) * fVar84) *
           dscale;
      (pvVar4->field_0).v[2] =
           (fVar93 * (fVar90 * fVar68 + fVar88 * fVar50 + fVar94 * fVar38 + fVar89 * fVar35) +
            (fVar32 * fVar90 + fVar65 * fVar88 + fVar78 * fVar94 + fVar29 * fVar89) * fVar92 +
            (fVar26 * fVar90 + fVar71 * fVar88 + fVar59 * fVar94 + fVar23 * fVar89) * fVar81 +
           (fVar20 * fVar90 + fVar17 * fVar88 + fVar14 * fVar94 + fVar67 * fVar89) * fVar84) *
           dscale;
      (pvVar4->field_0).v[3] =
           (fVar93 * (fVar90 * fVar69 + fVar88 * fVar52 + fVar94 * fVar39 + fVar89 * fVar36) +
            (fVar33 * fVar90 + fVar61 * fVar88 + fVar73 * fVar94 + fVar30 * fVar89) * fVar92 +
            (fVar27 * fVar90 + fVar66 * fVar88 + fVar58 * fVar94 + fVar24 * fVar89) * fVar81 +
           (fVar21 * fVar90 + fVar18 * fVar88 + fVar15 * fVar94 + fVar75 * fVar89) * fVar84) *
           dscale;
      fVar72 = pfVar41[0x14];
      fVar70 = pfVar41[0x15];
      fVar71 = pfVar41[0x16];
      fVar66 = pfVar41[0x17];
      fVar83 = pfVar41[0x18];
      fVar86 = pfVar41[0x19];
      fVar59 = pfVar41[0x1a];
      fVar58 = pfVar41[0x1b];
      fVar62 = pfVar41[0x24];
      fVar64 = pfVar41[0x25];
      fVar65 = pfVar41[0x26];
      fVar61 = pfVar41[0x27];
      fVar74 = pfVar41[0x28];
      fVar76 = pfVar41[0x29];
      fVar78 = pfVar41[0x2a];
      fVar73 = pfVar41[0x2b];
      if ((fVar79 != 1.0 && fVar79 != 0.0) && (fVar63 != 0.0 && fVar63 != 1.0)) {
        fVar55 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar55 * (pfVar41[0x40] * fVar79 + fVar72 * fVar63);
        fVar70 = fVar55 * (pfVar41[0x41] * fVar79 + fVar70 * fVar63);
        fVar71 = fVar55 * (pfVar41[0x42] * fVar79 + fVar71 * fVar63);
        fVar66 = fVar55 * (pfVar41[0x43] * fVar79 + fVar66 * fVar63);
        fVar55 = fVar51 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar55 * (fVar79 * fVar83 + pfVar41[0x44] * fVar51);
        fVar86 = fVar55 * (fVar79 * fVar86 + pfVar41[0x45] * fVar51);
        fVar59 = fVar55 * (fVar79 * fVar59 + pfVar41[0x46] * fVar51);
        fVar58 = fVar55 * (fVar79 * fVar58 + pfVar41[0x47] * fVar51);
        fVar55 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar74 = fVar55 * (pfVar41[0x4c] * fVar85 + fVar51 * fVar74);
        fVar76 = fVar55 * (pfVar41[0x4d] * fVar85 + fVar51 * fVar76);
        fVar78 = fVar55 * (pfVar41[0x4e] * fVar85 + fVar51 * fVar78);
        fVar73 = fVar55 * (pfVar41[0x4f] * fVar85 + fVar51 * fVar73);
        fVar55 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = fVar55 * (fVar85 * fVar62 + fVar63 * pfVar41[0x48]);
        fVar64 = fVar55 * (fVar85 * fVar64 + fVar63 * pfVar41[0x49]);
        fVar65 = fVar55 * (fVar85 * fVar65 + fVar63 * pfVar41[0x4a]);
        fVar61 = fVar55 * (fVar85 * fVar61 + fVar63 * pfVar41[0x4b]);
      }
      fVar93 = fVar51 * fVar80;
      fVar80 = fVar63 * 3.0 * fVar80;
      fVar89 = fVar89 * fVar51;
      fVar91 = fVar91 * fVar63;
      fVar55 = fVar79 * fVar85 + fVar79 * fVar85;
      fVar51 = (fVar56 - fVar55) * 3.0;
      fVar84 = (fVar55 - fVar87) * 3.0;
      fVar55 = pfVar41[0xd];
      fVar67 = pfVar41[0xe];
      fVar75 = pfVar41[0xf];
      fVar13 = pfVar41[9];
      fVar14 = pfVar41[10];
      fVar15 = pfVar41[0xb];
      fVar16 = pfVar41[5];
      fVar17 = pfVar41[6];
      fVar18 = pfVar41[7];
      fVar19 = pfVar41[1];
      fVar20 = pfVar41[2];
      fVar21 = pfVar41[3];
      fVar56 = fVar56 * -3.0;
      fVar22 = pfVar41[0x1d];
      fVar23 = pfVar41[0x1e];
      fVar24 = pfVar41[0x1f];
      fVar25 = pfVar41[0x11];
      fVar26 = pfVar41[0x12];
      fVar27 = pfVar41[0x13];
      fVar28 = pfVar41[0x2d];
      fVar29 = pfVar41[0x2e];
      fVar30 = pfVar41[0x2f];
      fVar31 = pfVar41[0x21];
      fVar32 = pfVar41[0x22];
      fVar33 = pfVar41[0x23];
      fVar34 = pfVar41[0x3d];
      fVar35 = pfVar41[0x3e];
      fVar36 = pfVar41[0x3f];
      fVar37 = pfVar41[0x39];
      fVar38 = pfVar41[0x3a];
      fVar39 = pfVar41[0x3b];
      fVar60 = pfVar41[0x35];
      fVar50 = pfVar41[0x36];
      fVar52 = pfVar41[0x37];
      fVar57 = pfVar41[0x31];
      fVar68 = pfVar41[0x32];
      fVar69 = pfVar41[0x33];
      (pvVar5->field_0).v[0] =
           dscale * (fVar77 * (fVar93 * pfVar41[0x30] +
                              fVar80 * pfVar41[0x34] +
                              fVar89 * pfVar41[0x38] + fVar91 * pfVar41[0x3c]) +
                     (pfVar41[0x20] * fVar93 +
                     fVar62 * fVar80 + fVar74 * fVar89 + pfVar41[0x2c] * fVar91) * fVar84 +
                     (pfVar41[0x10] * fVar93 +
                     fVar72 * fVar80 + fVar83 * fVar89 + pfVar41[0x1c] * fVar91) * fVar51 +
                    (*pfVar41 * fVar93 +
                    pfVar41[4] * fVar80 + pfVar41[8] * fVar89 + pfVar41[0xc] * fVar91) * fVar56);
      (pvVar5->field_0).v[1] =
           dscale * (fVar77 * (fVar93 * fVar57 + fVar80 * fVar60 + fVar89 * fVar37 + fVar91 * fVar34
                              ) +
                     (fVar31 * fVar93 + fVar64 * fVar80 + fVar76 * fVar89 + fVar28 * fVar91) *
                     fVar84 + (fVar25 * fVar93 + fVar70 * fVar80 + fVar86 * fVar89 + fVar22 * fVar91
                              ) * fVar51 +
                    (fVar19 * fVar93 + fVar16 * fVar80 + fVar13 * fVar89 + fVar55 * fVar91) * fVar56
                    );
      (pvVar5->field_0).v[2] =
           dscale * (fVar77 * (fVar93 * fVar68 + fVar80 * fVar50 + fVar89 * fVar38 + fVar91 * fVar35
                              ) +
                     (fVar32 * fVar93 + fVar65 * fVar80 + fVar78 * fVar89 + fVar29 * fVar91) *
                     fVar84 + (fVar26 * fVar93 + fVar71 * fVar80 + fVar59 * fVar89 + fVar23 * fVar91
                              ) * fVar51 +
                    (fVar20 * fVar93 + fVar17 * fVar80 + fVar14 * fVar89 + fVar67 * fVar91) * fVar56
                    );
      (pvVar5->field_0).v[3] =
           dscale * (fVar77 * (fVar93 * fVar69 + fVar80 * fVar52 + fVar89 * fVar39 + fVar91 * fVar36
                              ) +
                     (fVar33 * fVar93 + fVar61 * fVar80 + fVar73 * fVar89 + fVar30 * fVar91) *
                     fVar84 + (fVar27 * fVar93 + fVar66 * fVar80 + fVar58 * fVar89 + fVar24 * fVar91
                              ) * fVar51 +
                    (fVar21 * fVar93 + fVar18 * fVar80 + fVar15 * fVar89 + fVar75 * fVar91) * fVar56
                    );
    }
    bVar40 = true;
    if (pvVar6 != (vfloat_impl<4> *)0x0) {
      bVar11 = fVar63 != 1.0;
      bVar12 = fVar63 != 0.0;
      bVar9 = fVar79 != 0.0;
      bVar10 = fVar79 != 1.0;
      fVar72 = pfVar41[0x14];
      fVar70 = pfVar41[0x15];
      fVar71 = pfVar41[0x16];
      fVar66 = pfVar41[0x17];
      fVar83 = pfVar41[0x18];
      fVar86 = pfVar41[0x19];
      fVar59 = pfVar41[0x1a];
      fVar58 = pfVar41[0x1b];
      fVar62 = pfVar41[0x24];
      fVar64 = pfVar41[0x25];
      fVar65 = pfVar41[0x26];
      fVar61 = pfVar41[0x27];
      fVar74 = pfVar41[0x28];
      fVar76 = pfVar41[0x29];
      fVar78 = pfVar41[0x2a];
      fVar73 = pfVar41[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar55 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar67 = 1.0 - fVar79;
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar55 * (pfVar41[0x40] * fVar79 + fVar72 * fVar63);
        fVar70 = fVar55 * (pfVar41[0x41] * fVar79 + fVar70 * fVar63);
        fVar71 = fVar55 * (pfVar41[0x42] * fVar79 + fVar71 * fVar63);
        fVar66 = fVar55 * (pfVar41[0x43] * fVar79 + fVar66 * fVar63);
        fVar75 = 1.0 - fVar63;
        fVar55 = fVar75 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar55 * (fVar79 * fVar83 + pfVar41[0x44] * fVar75);
        fVar86 = fVar55 * (fVar79 * fVar86 + pfVar41[0x45] * fVar75);
        fVar59 = fVar55 * (fVar79 * fVar59 + pfVar41[0x46] * fVar75);
        fVar58 = fVar55 * (fVar79 * fVar58 + pfVar41[0x47] * fVar75);
        fVar55 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar74 = fVar55 * (pfVar41[0x4c] * fVar67 + fVar75 * fVar74);
        fVar76 = fVar55 * (pfVar41[0x4d] * fVar67 + fVar75 * fVar76);
        fVar78 = fVar55 * (pfVar41[0x4e] * fVar67 + fVar75 * fVar78);
        fVar73 = fVar55 * (pfVar41[0x4f] * fVar67 + fVar75 * fVar73);
        fVar55 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = fVar55 * (fVar67 * fVar62 + fVar63 * pfVar41[0x48]);
        fVar64 = fVar55 * (fVar67 * fVar64 + fVar63 * pfVar41[0x49]);
        fVar65 = fVar55 * (fVar67 * fVar65 + fVar63 * pfVar41[0x4a]);
        fVar61 = fVar55 * (fVar67 * fVar61 + fVar63 * pfVar41[0x4b]);
      }
      fVar77 = 1.0 - fVar63;
      fVar81 = fVar77 * 6.0;
      fVar93 = (fVar63 - (fVar77 + fVar77)) * 6.0;
      fVar85 = (fVar77 - (fVar63 + fVar63)) * 6.0;
      fVar88 = fVar63 * 6.0;
      fVar90 = fVar79 * fVar79;
      fVar87 = 1.0 - fVar79;
      fVar89 = fVar87 * fVar87;
      fVar55 = pfVar41[0xd];
      fVar67 = pfVar41[0xe];
      fVar75 = pfVar41[0xf];
      fVar13 = pfVar41[9];
      fVar14 = pfVar41[10];
      fVar15 = pfVar41[0xb];
      fVar16 = pfVar41[5];
      fVar17 = pfVar41[6];
      fVar18 = pfVar41[7];
      fVar19 = pfVar41[1];
      fVar20 = pfVar41[2];
      fVar21 = pfVar41[3];
      fVar80 = fVar87 * fVar89;
      fVar22 = pfVar41[0x1d];
      fVar23 = pfVar41[0x1e];
      fVar24 = pfVar41[0x1f];
      fVar25 = pfVar41[0x11];
      fVar26 = pfVar41[0x12];
      fVar27 = pfVar41[0x13];
      fVar91 = fVar90 * 3.0;
      fVar84 = fVar79 * 3.0 * fVar89;
      fVar28 = pfVar41[0x2d];
      fVar29 = pfVar41[0x2e];
      fVar30 = pfVar41[0x2f];
      fVar31 = pfVar41[0x21];
      fVar32 = pfVar41[0x22];
      fVar33 = pfVar41[0x23];
      fVar51 = fVar87 * fVar91;
      fVar34 = pfVar41[0x3d];
      fVar35 = pfVar41[0x3e];
      fVar36 = pfVar41[0x3f];
      fVar37 = pfVar41[0x39];
      fVar38 = pfVar41[0x3a];
      fVar39 = pfVar41[0x3b];
      fVar60 = pfVar41[0x35];
      fVar50 = pfVar41[0x36];
      fVar52 = pfVar41[0x37];
      fVar57 = pfVar41[0x31];
      fVar68 = pfVar41[0x32];
      fVar69 = pfVar41[0x33];
      fVar56 = fVar79 * fVar90;
      fVar92 = dscale * dscale;
      (pvVar6->field_0).v[0] =
           (fVar56 * (fVar81 * pfVar41[0x30] +
                     fVar93 * pfVar41[0x34] + fVar85 * pfVar41[0x38] + fVar88 * pfVar41[0x3c]) +
            (pfVar41[0x20] * fVar81 + fVar62 * fVar93 + fVar74 * fVar85 + pfVar41[0x2c] * fVar88) *
            fVar51 + (pfVar41[0x10] * fVar81 +
                     fVar72 * fVar93 + fVar83 * fVar85 + pfVar41[0x1c] * fVar88) * fVar84 +
           (*pfVar41 * fVar81 + pfVar41[4] * fVar93 + pfVar41[8] * fVar85 + pfVar41[0xc] * fVar88) *
           fVar80) * fVar92;
      (pvVar6->field_0).v[1] =
           (fVar56 * (fVar81 * fVar57 + fVar93 * fVar60 + fVar85 * fVar37 + fVar88 * fVar34) +
            (fVar31 * fVar81 + fVar64 * fVar93 + fVar76 * fVar85 + fVar28 * fVar88) * fVar51 +
            (fVar25 * fVar81 + fVar70 * fVar93 + fVar86 * fVar85 + fVar22 * fVar88) * fVar84 +
           (fVar19 * fVar81 + fVar16 * fVar93 + fVar13 * fVar85 + fVar55 * fVar88) * fVar80) *
           fVar92;
      (pvVar6->field_0).v[2] =
           (fVar56 * (fVar81 * fVar68 + fVar93 * fVar50 + fVar85 * fVar38 + fVar88 * fVar35) +
            (fVar32 * fVar81 + fVar65 * fVar93 + fVar78 * fVar85 + fVar29 * fVar88) * fVar51 +
            (fVar26 * fVar81 + fVar71 * fVar93 + fVar59 * fVar85 + fVar23 * fVar88) * fVar84 +
           (fVar20 * fVar81 + fVar17 * fVar93 + fVar14 * fVar85 + fVar67 * fVar88) * fVar80) *
           fVar92;
      (pvVar6->field_0).v[3] =
           (fVar56 * (fVar81 * fVar69 + fVar93 * fVar52 + fVar85 * fVar39 + fVar88 * fVar36) +
            (fVar33 * fVar81 + fVar61 * fVar93 + fVar73 * fVar85 + fVar30 * fVar88) * fVar51 +
            (fVar27 * fVar81 + fVar66 * fVar93 + fVar58 * fVar85 + fVar24 * fVar88) * fVar84 +
           (fVar21 * fVar81 + fVar18 * fVar93 + fVar15 * fVar85 + fVar75 * fVar88) * fVar80) *
           fVar92;
      fVar72 = pfVar41[0x14];
      fVar70 = pfVar41[0x15];
      fVar71 = pfVar41[0x16];
      fVar66 = pfVar41[0x17];
      fVar83 = pfVar41[0x18];
      fVar86 = pfVar41[0x19];
      fVar59 = pfVar41[0x1a];
      fVar58 = pfVar41[0x1b];
      local_de0._0_4_ = pfVar41[0x24];
      local_de0._4_4_ = pfVar41[0x25];
      uStack_dd8._0_4_ = pfVar41[0x26];
      uStack_dd8._4_4_ = pfVar41[0x27];
      fVar62 = pfVar41[0x28];
      fVar64 = pfVar41[0x29];
      fVar65 = pfVar41[0x2a];
      fVar61 = pfVar41[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar74 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
        fVar74 = (2.0 - fVar74 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar74 * (pfVar41[0x40] * fVar79 + fVar72 * fVar63);
        fVar70 = fVar74 * (pfVar41[0x41] * fVar79 + fVar70 * fVar63);
        fVar71 = fVar74 * (pfVar41[0x42] * fVar79 + fVar71 * fVar63);
        fVar66 = fVar74 * (pfVar41[0x43] * fVar79 + fVar66 * fVar63);
        fVar74 = fVar77 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
        fVar74 = (2.0 - fVar74 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar74 * (fVar79 * fVar83 + pfVar41[0x44] * fVar77);
        fVar86 = fVar74 * (fVar79 * fVar86 + pfVar41[0x45] * fVar77);
        fVar59 = fVar74 * (fVar79 * fVar59 + pfVar41[0x46] * fVar77);
        fVar58 = fVar74 * (fVar79 * fVar58 + pfVar41[0x47] * fVar77);
        fVar74 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
        fVar74 = (2.0 - fVar74 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = fVar74 * (pfVar41[0x4c] * fVar87 + fVar77 * fVar62);
        fVar64 = fVar74 * (pfVar41[0x4d] * fVar87 + fVar77 * fVar64);
        fVar65 = fVar74 * (pfVar41[0x4e] * fVar87 + fVar77 * fVar65);
        fVar61 = fVar74 * (pfVar41[0x4f] * fVar87 + fVar77 * fVar61);
        fVar74 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74));
        fVar74 = (2.0 - fVar74 * auVar82._0_4_) * auVar82._0_4_;
        local_de0._0_4_ = ((float)local_de0 * fVar87 + fVar63 * pfVar41[0x48]) * fVar74;
        local_de0._4_4_ = (local_de0._4_4_ * fVar87 + fVar63 * pfVar41[0x49]) * fVar74;
        uStack_dd8._0_4_ = ((float)uStack_dd8 * fVar87 + fVar63 * pfVar41[0x4a]) * fVar74;
        uStack_dd8._4_4_ = (uStack_dd8._4_4_ * fVar87 + fVar63 * pfVar41[0x4b]) * fVar74;
      }
      fVar93 = fVar77 * fVar77;
      fVar52 = fVar63 * 3.0 * fVar93;
      fVar68 = fVar63 * fVar63;
      fVar57 = fVar68 * 3.0;
      fVar51 = fVar77 * fVar57;
      fVar84 = fVar63 * fVar68;
      fVar74 = pfVar41[0xd];
      fVar76 = pfVar41[0xe];
      fVar78 = pfVar41[0xf];
      fVar73 = pfVar41[9];
      fVar55 = pfVar41[10];
      fVar67 = pfVar41[0xb];
      fVar75 = pfVar41[5];
      fVar13 = pfVar41[6];
      fVar14 = pfVar41[7];
      fVar85 = fVar77 * fVar93;
      fVar15 = pfVar41[1];
      fVar16 = pfVar41[2];
      fVar17 = pfVar41[3];
      fVar80 = fVar87 * 6.0;
      fVar18 = pfVar41[0x1d];
      fVar19 = pfVar41[0x1e];
      fVar20 = pfVar41[0x1f];
      fVar21 = pfVar41[0x11];
      fVar22 = pfVar41[0x12];
      fVar23 = pfVar41[0x13];
      fVar81 = (fVar79 - (fVar87 + fVar87)) * 6.0;
      fVar24 = pfVar41[0x2d];
      fVar25 = pfVar41[0x2e];
      fVar26 = pfVar41[0x2f];
      fVar27 = pfVar41[0x21];
      fVar28 = pfVar41[0x22];
      fVar29 = pfVar41[0x23];
      fVar69 = (fVar87 - (fVar79 + fVar79)) * 6.0;
      fVar30 = pfVar41[0x3d];
      fVar31 = pfVar41[0x3e];
      fVar32 = pfVar41[0x3f];
      fVar33 = pfVar41[0x39];
      fVar34 = pfVar41[0x3a];
      fVar35 = pfVar41[0x3b];
      fVar36 = pfVar41[0x35];
      fVar37 = pfVar41[0x36];
      fVar38 = pfVar41[0x37];
      fVar39 = pfVar41[0x31];
      fVar60 = pfVar41[0x32];
      fVar50 = pfVar41[0x33];
      fVar56 = fVar79 * 6.0;
      (pvVar7->field_0).v[0] =
           (fVar56 * (fVar85 * pfVar41[0x30] +
                     fVar52 * pfVar41[0x34] + fVar51 * pfVar41[0x38] + fVar84 * pfVar41[0x3c]) +
            (pfVar41[0x20] * fVar85 +
            (float)local_de0 * fVar52 + fVar62 * fVar51 + pfVar41[0x2c] * fVar84) * fVar69 +
            (pfVar41[0x10] * fVar85 + fVar72 * fVar52 + fVar83 * fVar51 + pfVar41[0x1c] * fVar84) *
            fVar81 + (*pfVar41 * fVar85 +
                     pfVar41[4] * fVar52 + pfVar41[8] * fVar51 + pfVar41[0xc] * fVar84) * fVar80) *
           fVar92;
      (pvVar7->field_0).v[1] =
           (fVar56 * (fVar85 * fVar39 + fVar52 * fVar36 + fVar51 * fVar33 + fVar84 * fVar30) +
            (fVar27 * fVar85 + local_de0._4_4_ * fVar52 + fVar64 * fVar51 + fVar24 * fVar84) *
            fVar69 + (fVar21 * fVar85 + fVar70 * fVar52 + fVar86 * fVar51 + fVar18 * fVar84) *
                     fVar81 +
           (fVar15 * fVar85 + fVar75 * fVar52 + fVar73 * fVar51 + fVar74 * fVar84) * fVar80) *
           fVar92;
      (pvVar7->field_0).v[2] =
           (fVar56 * (fVar85 * fVar60 + fVar52 * fVar37 + fVar51 * fVar34 + fVar84 * fVar31) +
            (fVar28 * fVar85 + (float)uStack_dd8 * fVar52 + fVar65 * fVar51 + fVar25 * fVar84) *
            fVar69 + (fVar22 * fVar85 + fVar71 * fVar52 + fVar59 * fVar51 + fVar19 * fVar84) *
                     fVar81 +
           (fVar16 * fVar85 + fVar13 * fVar52 + fVar55 * fVar51 + fVar76 * fVar84) * fVar80) *
           fVar92;
      (pvVar7->field_0).v[3] =
           (fVar56 * (fVar85 * fVar50 + fVar52 * fVar38 + fVar51 * fVar35 + fVar84 * fVar32) +
            (fVar29 * fVar85 + uStack_dd8._4_4_ * fVar52 + fVar61 * fVar51 + fVar26 * fVar84) *
            fVar69 + (fVar23 * fVar85 + fVar66 * fVar52 + fVar58 * fVar51 + fVar20 * fVar84) *
                     fVar81 +
           (fVar17 * fVar85 + fVar14 * fVar52 + fVar67 * fVar51 + fVar78 * fVar84) * fVar80) *
           fVar92;
      fVar72 = pfVar41[0x14];
      fVar70 = pfVar41[0x15];
      fVar71 = pfVar41[0x16];
      fVar66 = pfVar41[0x17];
      fVar83 = pfVar41[0x18];
      fVar86 = pfVar41[0x19];
      fVar59 = pfVar41[0x1a];
      fVar58 = pfVar41[0x1b];
      fVar62 = pfVar41[0x24];
      fVar64 = pfVar41[0x25];
      fVar65 = pfVar41[0x26];
      fVar61 = pfVar41[0x27];
      fVar74 = pfVar41[0x28];
      fVar76 = pfVar41[0x29];
      fVar78 = pfVar41[0x2a];
      fVar73 = pfVar41[0x2b];
      if ((bVar10 && bVar9) && (bVar12 && bVar11)) {
        fVar55 = fVar63 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar72 = fVar55 * (pfVar41[0x40] * fVar79 + fVar72 * fVar63);
        fVar70 = fVar55 * (pfVar41[0x41] * fVar79 + fVar70 * fVar63);
        fVar71 = fVar55 * (pfVar41[0x42] * fVar79 + fVar71 * fVar63);
        fVar66 = fVar55 * (pfVar41[0x43] * fVar79 + fVar66 * fVar63);
        fVar55 = fVar77 + fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar83 = fVar55 * (fVar79 * fVar83 + pfVar41[0x44] * fVar77);
        fVar86 = fVar55 * (fVar79 * fVar86 + pfVar41[0x45] * fVar77);
        fVar59 = fVar55 * (fVar79 * fVar59 + pfVar41[0x46] * fVar77);
        fVar58 = fVar55 * (fVar79 * fVar58 + pfVar41[0x47] * fVar77);
        fVar55 = (2.0 - fVar63) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar74 = fVar55 * (pfVar41[0x4c] * fVar87 + fVar77 * fVar74);
        fVar76 = fVar55 * (pfVar41[0x4d] * fVar87 + fVar77 * fVar76);
        fVar78 = fVar55 * (pfVar41[0x4e] * fVar87 + fVar77 * fVar78);
        fVar73 = fVar55 * (pfVar41[0x4f] * fVar87 + fVar77 * fVar73);
        fVar55 = (fVar63 + 1.0) - fVar79;
        auVar82 = rcpss(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55));
        fVar55 = (2.0 - fVar55 * auVar82._0_4_) * auVar82._0_4_;
        fVar62 = (fVar62 * fVar87 + fVar63 * pfVar41[0x48]) * fVar55;
        fVar64 = (fVar64 * fVar87 + fVar63 * pfVar41[0x49]) * fVar55;
        fVar65 = (fVar65 * fVar87 + fVar63 * pfVar41[0x4a]) * fVar55;
        fVar61 = (fVar61 * fVar87 + fVar63 * pfVar41[0x4b]) * fVar55;
      }
      fVar63 = fVar63 * fVar77 + fVar63 * fVar77;
      fVar77 = fVar93 * -3.0;
      fVar69 = (fVar93 - fVar63) * 3.0;
      fVar56 = (fVar63 - fVar68) * 3.0;
      fVar63 = fVar79 * fVar87 + fVar79 * fVar87;
      fVar84 = fVar89 * -3.0;
      fVar51 = (fVar89 - fVar63) * 3.0;
      fVar80 = (fVar63 - fVar90) * 3.0;
      fVar63 = pfVar41[0xd];
      fVar79 = pfVar41[0xe];
      fVar55 = pfVar41[0xf];
      fVar67 = pfVar41[9];
      fVar75 = pfVar41[10];
      fVar13 = pfVar41[0xb];
      fVar14 = pfVar41[5];
      fVar15 = pfVar41[6];
      fVar16 = pfVar41[7];
      fVar17 = pfVar41[1];
      fVar18 = pfVar41[2];
      fVar19 = pfVar41[3];
      fVar20 = pfVar41[0x1d];
      fVar21 = pfVar41[0x1e];
      fVar22 = pfVar41[0x1f];
      fVar23 = pfVar41[0x11];
      fVar24 = pfVar41[0x12];
      fVar25 = pfVar41[0x13];
      fVar26 = pfVar41[0x2d];
      fVar27 = pfVar41[0x2e];
      fVar28 = pfVar41[0x2f];
      fVar29 = pfVar41[0x21];
      fVar30 = pfVar41[0x22];
      fVar31 = pfVar41[0x23];
      fVar32 = pfVar41[0x3d];
      fVar33 = pfVar41[0x3e];
      fVar34 = pfVar41[0x3f];
      fVar35 = pfVar41[0x39];
      fVar36 = pfVar41[0x3a];
      fVar37 = pfVar41[0x3b];
      fVar38 = pfVar41[0x35];
      fVar39 = pfVar41[0x36];
      fVar60 = pfVar41[0x37];
      fVar50 = pfVar41[0x31];
      fVar52 = pfVar41[0x32];
      fVar68 = pfVar41[0x33];
      (pvVar8->field_0).v[0] =
           fVar92 * (fVar91 * (fVar77 * pfVar41[0x30] +
                              fVar69 * pfVar41[0x34] +
                              fVar56 * pfVar41[0x38] + fVar57 * pfVar41[0x3c]) +
                     (pfVar41[0x20] * fVar77 +
                     fVar62 * fVar69 + fVar74 * fVar56 + pfVar41[0x2c] * fVar57) * fVar80 +
                     (pfVar41[0x10] * fVar77 +
                     fVar72 * fVar69 + fVar83 * fVar56 + pfVar41[0x1c] * fVar57) * fVar51 +
                    (*pfVar41 * fVar77 +
                    pfVar41[4] * fVar69 + pfVar41[8] * fVar56 + pfVar41[0xc] * fVar57) * fVar84);
      (pvVar8->field_0).v[1] =
           fVar92 * (fVar91 * (fVar77 * fVar50 + fVar69 * fVar38 + fVar56 * fVar35 + fVar57 * fVar32
                              ) +
                     (fVar29 * fVar77 + fVar64 * fVar69 + fVar76 * fVar56 + fVar26 * fVar57) *
                     fVar80 + (fVar23 * fVar77 + fVar70 * fVar69 + fVar86 * fVar56 + fVar20 * fVar57
                              ) * fVar51 +
                    (fVar17 * fVar77 + fVar14 * fVar69 + fVar67 * fVar56 + fVar63 * fVar57) * fVar84
                    );
      (pvVar8->field_0).v[2] =
           fVar92 * (fVar91 * (fVar77 * fVar52 + fVar69 * fVar39 + fVar56 * fVar36 + fVar57 * fVar33
                              ) +
                     (fVar30 * fVar77 + fVar65 * fVar69 + fVar78 * fVar56 + fVar27 * fVar57) *
                     fVar80 + (fVar24 * fVar77 + fVar71 * fVar69 + fVar59 * fVar56 + fVar21 * fVar57
                              ) * fVar51 +
                    (fVar18 * fVar77 + fVar15 * fVar69 + fVar75 * fVar56 + fVar79 * fVar57) * fVar84
                    );
      (pvVar8->field_0).v[3] =
           fVar92 * (fVar91 * (fVar77 * fVar68 + fVar69 * fVar60 + fVar56 * fVar37 + fVar57 * fVar34
                              ) +
                     (fVar31 * fVar77 + fVar61 * fVar69 + fVar73 * fVar56 + fVar28 * fVar57) *
                     fVar80 + (fVar25 * fVar77 + fVar66 * fVar69 + fVar58 * fVar56 + fVar22 * fVar57
                              ) * fVar51 +
                    (fVar19 * fVar77 + fVar16 * fVar69 + fVar13 * fVar56 + fVar55 * fVar57) * fVar84
                    );
    }
    break;
  case 7:
    bVar40 = eval_general(this,(SubdividedGeneralPatch *)(This.ptr & 0xfffffffffffffff0),*u,*v,depth
                         );
    break;
  case 8:
    psVar45 = (size_t *)(This.ptr & 0xfffffffffffffff0);
    local_d80.ring.items[0].border_index = (int)*u;
    fVar63 = *v;
    if (0.5 <= fVar63) {
      local_e38.field_0.x = fVar63 + fVar63 + -1.0;
      if ((float)local_d80.ring.items[0].border_index <= 0.5) {
        This_00.ptr = psVar45[3];
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                  (float)local_d80.ring.items[0].border_index);
      }
      else {
        This_00.ptr = psVar45[2];
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                   (float)local_d80.ring.items[0].border_index + -1.0);
      }
    }
    else {
      if (0.5 <= (float)local_d80.ring.items[0].border_index) {
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                   (float)local_d80.ring.items[0].border_index + -1.0);
        This_00.ptr = psVar45[1];
      }
      else {
        This_00.ptr = *psVar45;
        local_d80.ring.items[0].border_index =
             (int)((float)local_d80.ring.items[0].border_index +
                  (float)local_d80.ring.items[0].border_index);
      }
      local_e38.field_0.x = fVar63 + fVar63;
    }
    bVar40 = eval(this,This_00,(float *)&local_d80,local_e38.components,dscale + dscale,depth + 1);
    break;
  case 9:
    uStack_e08 = local_e10;
    local_e10 = depth;
    pDVar44 = &local_d80.ring.items[0].crease_weight;
    lVar42 = 0;
    do {
      *(long *)((long)local_d80.ring.items[0].crease_weight.arr + lVar42 + 0x40) =
           (long)pDVar44->arr + lVar42;
      *(undefined8 *)((long)local_d80.ring.items[0].ring.arr + lVar42 + -0x38) = 0;
      *(long *)((long)&local_d80.ring.items[0].ring.data + lVar42) =
           (long)&local_d80.ring.items[0].ring.arr[0].field_0 + lVar42;
      lVar42 = lVar42 + 0x340;
    } while (lVar42 != 0xd00);
    uVar46 = This.ptr & 0xfffffffffffffff0;
    lVar49 = 0;
    lVar42 = 0;
    local_e00 = v;
    local_df0 = this;
    local_dd0 = u;
    do {
      local_d80.ring.items[lVar49].border_index = *(int *)(uVar46 + lVar42);
      uVar2 = *(uint *)(uVar46 + 4 + lVar42);
      local_d80.ring.items[lVar49].face_valence = uVar2;
      local_d80.ring.items[lVar49].edge_valence = uVar2 * 2;
      local_d80.ring.items[lVar49].vertex_crease_weight = *(float *)(uVar46 + 8 + lVar42);
      lVar48 = lVar42 + 0xc;
      if (uVar2 != 0) {
        uVar43 = 0;
        do {
          if ((0xf < uVar43) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              local_d80.ring.items[lVar49].crease_weight.data ==
              &local_d80.ring.items[lVar49].crease_weight)) {
            pfVar41 = (float *)operator_new__(0x100);
            local_d80.ring.items[lVar49].crease_weight.data = pfVar41;
            lVar42 = 0;
            do {
              local_d80.ring.items[lVar49].crease_weight.data[lVar42] = pDVar44->arr[lVar42];
              lVar42 = lVar42 + 1;
            } while (lVar42 != 0x10);
          }
          local_d80.ring.items[lVar49].crease_weight.data[uVar43] = *(float *)(uVar46 + lVar48);
          uVar43 = uVar43 + 1;
          lVar48 = lVar48 + 4;
        } while (uVar43 < local_d80.ring.items[lVar49].face_valence);
      }
      local_d80.ring.items[lVar49].vertex_level = *(float *)(uVar46 + lVar48);
      local_d80.ring.items[lVar49].edge_level = *(float *)(uVar46 + 4 + lVar48);
      local_d80.ring.items[lVar49].eval_start_index = *(uint *)(uVar46 + 8 + lVar48);
      local_d80.ring.items[lVar49].eval_unique_identifier = *(uint *)(uVar46 + 0xc + lVar48);
      puVar1 = (undefined8 *)(uVar46 + 0x10 + lVar48);
      uVar53 = puVar1[1];
      *(undefined8 *)&local_d80.ring.items[lVar49].vtx.field_0 = *puVar1;
      *(undefined8 *)((long)&local_d80.ring.items[lVar49].vtx.field_0 + 8) = uVar53;
      lVar42 = lVar48 + 0x20;
      if (local_d80.ring.items[lVar49].edge_valence != 0) {
        local_e20 = &local_d80.ring.items[lVar49].ring;
        local_e30 = &local_d80.ring.items[lVar49].ring.data;
        lVar47 = 0;
        uVar43 = 0;
        do {
          puVar1 = (undefined8 *)(lVar48 + uVar46 + 0x20 + lVar47);
          uVar53 = *puVar1;
          uVar54 = puVar1[1];
          if ((0x1f < uVar43) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)*local_e30 == local_e20)) {
            local_de0 = uVar53;
            uStack_dd8 = uVar54;
            alignedMalloc(0x800,0x10);
            PatchEval<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::eval();
            uVar53 = local_de0;
            uVar54 = uStack_dd8;
          }
          uVar43 = uVar43 + 1;
          puVar1 = (undefined8 *)((long)&(local_d80.ring.items[lVar49].ring.data)->field_0 + lVar47)
          ;
          *puVar1 = uVar53;
          puVar1[1] = uVar54;
          lVar47 = lVar47 + 0x10;
        } while (uVar43 < local_d80.ring.items[lVar49].edge_valence);
        lVar42 = lVar42 + lVar47;
      }
      lVar49 = lVar49 + 1;
      pDVar44 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar44 + 6) + 0x40);
    } while (lVar49 != 4);
    local_e38.field_0.x = *local_dd0;
    local_e38.field_0.y = *local_e00;
    local_db0.P = local_df0->P;
    local_db0.dPdu = local_df0->dPdu;
    local_db0.dPdv = local_df0->dPdv;
    local_db0.ddPdudu = local_df0->ddPdudu;
    local_db0.ddPdvdv = local_df0->ddPdvdv;
    local_db0.ddPdudv = local_df0->ddPdudv;
    FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
              (&local_db0,&local_d80,(Vec2f *)&local_e38.field_0,dscale,local_e10,(BezierCurve *)0x0
               ,(BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0);
    lVar42 = -0xd00;
    pDVar44 = &local_d80.ring.items[3].crease_weight;
    do {
      pvVar3 = *(vfloat_impl<4> **)((vfloat_impl<4> *)(pDVar44 + 5) + 4);
      if (pvVar3 != (vfloat_impl<4> *)0x0 &&
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)(pDVar44 + 1) + 0x40) !=
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar3) {
        alignedFree(pvVar3);
      }
      pfVar41 = pDVar44->data;
      if (pfVar41 != (float *)0x0 && pDVar44 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar41) {
        operator_delete__(pfVar41);
      }
      pDVar44 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar44 + -7) + 0x40);
      lVar42 = lVar42 + 0x340;
    } while (lVar42 != 0);
LAB_00e24669:
    bVar40 = true;
  }
  return bVar40;
}

Assistant:

bool eval(Ref This, const float& u, const float& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          //PRINT(depth);
          //PRINT2(u,v);
          
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            //PRINT("bilinear");
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,c,c);
            return true;
          }
          case Patch::BSPLINE_PATCH: {
            //PRINT("bspline");
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::BEZIER_PATCH: {
            //PRINT("bezier");
            ((typename Patch::BezierPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::GREGORY_PATCH: {
            //PRINT("gregory");
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,-1,c);
            return true;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            //PRINT("subdivided quad");
            return eval_quad(((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            //PRINT("general_patch");
            assert(dscale == 1.0f); 
            return eval_general(((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            //PRINT("eval_patch");
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEval<Vertex,Vertex_t>(patch,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
            return true;
          }
          default: 
            assert(false); 
            return false;
          }
        }